

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O2

SquareMatrix<3> * pbrt::Transpose<3>(SquareMatrix<3> *__return_storage_ptr__,SquareMatrix<3> *m)

{
  Float (*paFVar1) [3];
  int i;
  long lVar2;
  Float (*paFVar3) [3];
  Float (*paFVar4) [3];
  long lVar5;
  
  SquareMatrix<3>::SquareMatrix(__return_storage_ptr__);
  paFVar3 = (Float (*) [3])__return_storage_ptr__;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    paFVar4 = (Float (*) [3])m;
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      paFVar1 = (Float (*) [3])*paFVar4;
      paFVar4 = paFVar4 + 1;
      (*(Float (*) [3])*paFVar3)[lVar5] = (*paFVar1)[0];
    }
    m = (SquareMatrix<3> *)(*(Float (*) [3])m + 1);
    paFVar3 = paFVar3 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU inline SquareMatrix<N> Transpose(const SquareMatrix<N> &m) {
    SquareMatrix<N> r;
    for (int i = 0; i < N; ++i)
        for (int j = 0; j < N; ++j)
            r[i][j] = m[j][i];
    return r;
}